

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scenario.cpp
# Opt level: O2

string * __thiscall
multi_agent_planning::Interaction::toString_abi_cxx11_
          (string *__return_storage_ptr__,Interaction *this)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  ostream *poVar2;
  stringstream ss;
  stringstream asStack_198 [16];
  undefined1 local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  pbVar1 = (basic_ostream<char,_std::char_traits<char>_> *)
           std::ostream::operator<<(local_188,this->agentA);
  pbVar1 = std::operator<<(pbVar1,&this->actionA);
  poVar2 = std::operator<<(pbVar1," -> ");
  pbVar1 = (basic_ostream<char,_std::char_traits<char>_> *)
           std::ostream::operator<<(poVar2,this->agentB);
  pbVar1 = std::operator<<(pbVar1,&this->actionB);
  poVar2 = std::operator<<(pbVar1,": ");
  std::ostream::operator<<(poVar2,this->cost);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

string Interaction::toString() const {
	stringstream ss;
	ss << agentA << actionA << " -> " << agentB << actionB << ": " << cost;
	return ss.str();
}